

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  pointer ppTVar3;
  int iVar4;
  pointer ppTVar5;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestInfo *pTVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  undefined1 local_b8 [8];
  string kTestsuite;
  long local_88;
  undefined1 local_78 [8];
  string kIndent;
  string local_50;
  
  local_b8 = (undefined1  [8])&kTestsuite._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"testsuite","");
  local_78 = (undefined1  [8])&kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)local_78,'\x06');
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x04');
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kTestsuite.field_2._M_local_buf + 8),(test_suite->name_)._M_dataplus._M_p,
             (allocator<char> *)(kIndent.field_2._M_local_buf + 0xf));
  OutputJsonKey(stream,(string *)local_b8,&local_50,(string *)((long)&kTestsuite.field_2 + 8),
                (string *)local_78,true);
  if ((long *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)kTestsuite.field_2._8_8_,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tests","");
  ppTVar3 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar5 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar3 == ppTVar5) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      uVar8 = (*ppTVar3)->is_in_another_shard_ ^ 1;
      if ((*ppTVar3)->matches_filter_ == false) {
        uVar8 = 0;
      }
      iVar4 = iVar4 + uVar8;
      ppTVar3 = ppTVar3 + 1;
    } while (ppTVar3 != ppTVar5);
  }
  OutputJsonKey(stream,(string *)local_b8,&local_50,iVar4,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (FLAGS_gtest_list_tests == '\0') {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failures","");
    iVar4 = TestSuite::failed_test_count(test_suite);
    OutputJsonKey(stream,(string *)local_b8,&local_50,iVar4,(string *)local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"disabled","");
    iVar4 = 0;
    for (ppTVar3 = (test_suite->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar3 !=
        (test_suite->test_info_list_).
        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
      pTVar6 = *ppTVar3;
      uVar8 = 0;
      if ((pTVar6->matches_filter_ == true) && ((pTVar6->is_in_another_shard_ & 1U) == 0)) {
        uVar8 = (uint)pTVar6->is_disabled_;
      }
      iVar4 = iVar4 + uVar8;
    }
    OutputJsonKey(stream,(string *)local_b8,&local_50,iVar4,(string *)local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"errors","");
    OutputJsonKey(stream,(string *)local_b8,&local_50,0,(string *)local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_suite->start_timestamp_,ms
              );
    OutputJsonKey(stream,(string *)local_b8,&local_50,(string *)((long)&kTestsuite.field_2 + 8),
                  (string *)local_78,true);
    if ((long *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff78) {
      operator_delete((void *)kTestsuite.field_2._8_8_,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_
              ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_suite->elapsed_time_,ms_00
              );
    OutputJsonKey(stream,(string *)local_b8,&local_50,(string *)((long)&kTestsuite.field_2 + 8),
                  (string *)local_78,false);
    if ((long *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff78) {
      operator_delete((void *)kTestsuite.field_2._8_8_,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    TestPropertiesAsJson(&local_50,&test_suite->ad_hoc_test_result_,(string *)local_78);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_78,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_b8,(long)kTestsuite._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": [\n",5);
  ppTVar3 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar5 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppTVar5 - (long)ppTVar3) >> 3)) {
    lVar9 = 0;
    bVar7 = false;
    do {
      pTVar6 = ppTVar3[(uint)(test_suite->test_indices_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar9]];
      if ((pTVar6->matches_filter_ == true) && ((pTVar6->is_in_another_shard_ & 1U) == 0)) {
        if (bVar7) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
          pTVar6 = (test_suite->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(uint)(test_suite->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar9]];
        }
        OutputJsonTestInfo(stream,(test_suite->name_)._M_dataplus._M_p,pTVar6);
        ppTVar3 = (test_suite->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar5 = (test_suite->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        bVar7 = true;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)((ulong)((long)ppTVar5 - (long)ppTVar3) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_78,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x04');
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != (undefined1  [8])&kIndent._M_string_length) {
    operator_delete((void *)local_78,kIndent._M_string_length + 1);
  }
  if (local_b8 != (undefined1  [8])&kTestsuite._M_string_length) {
    operator_delete((void *)local_b8,kTestsuite._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}